

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  size_t *psVar1;
  internalJSONNode *ptr;
  internalJSONNode *piVar2;
  
  piVar2 = this->internal;
  ptr = other->internal;
  if (piVar2 != ptr) {
    psVar1 = &ptr->refcount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      internalJSONNode::deleteInternal(ptr);
      piVar2 = this->internal;
    }
    piVar2->refcount = piVar2->refcount + 1;
    other->internal = piVar2;
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode * other) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (internal == other -> internal) return;
	   *other = *this;
    }